

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O1

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string,std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  nextCallback;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  undefined1 local_a8 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_88;
  _Any_data local_68;
  code *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar4 = (int)arguments;
  lVar1 = *(long *)&(callback->super__Function_base)._M_functor;
  if ((ulong)(long)iVar4 <
      (ulong)(*(long *)((long)&(callback->super__Function_base)._M_functor + 8) - lVar1 >> 5)) {
    lVar5 = (long)iVar4 * 0x20;
    lVar2 = *(long *)(lVar1 + lVar5);
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,lVar2,*(long *)(lVar1 + 8 + lVar5) + lVar2);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)&local_68,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)this);
    local_48[0] = &local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,local_c8,local_c0 + (long)local_c8)
    ;
    std::function<void(std::__cxx11::string)>::
    function<Console::bindCallback<std::__cxx11::string,std::__cxx11::string>(std::function<void(std::__cxx11::string,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda(std::__cxx11::string)_1_,void>
              ((function<void(std::__cxx11::string)> *)(local_a8 + 0x20),
               (anon_class_64_2_4fe94ccd *)&local_68);
    if (local_48[0] != &local_38) {
      operator_delete(local_48[0],local_38._M_allocated_capacity + 1);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)local_a8,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)(local_a8 + 0x20));
    bindCallback<std::__cxx11::string>
              (__return_storage_ptr__,(Console *)local_a8,
               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)callback,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(ulong)(iVar4 + 1),argumentIndex);
    if ((_Hash_node_base *)local_a8._16_8_ != (_Hash_node_base *)0x0) {
      (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
    }
    if ((__node_base_ptr)local_88.super__Function_base._M_manager != (__node_base_ptr)0x0) {
      (*local_88.super__Function_base._M_manager)(local_a8 + 0x20,local_a8 + 0x20,3);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  __clang_call_terminate(uVar3);
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}